

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_get_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *permut,
          uint *param_2)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  uint *puVar7;
  CImgArgumentException *this_00;
  uint uVar8;
  long lVar9;
  uint *puVar10;
  int iVar11;
  long lVar12;
  int y_1;
  long lVar13;
  int y;
  long lVar14;
  long lVar15;
  char *pcVar16;
  uint *puVar17;
  CImg<unsigned_int> res;
  
  bVar5 = is_empty(this);
  if (permut == (char *)0x0 || bVar5) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  res._data = (uint *)0x0;
  res._width = 0;
  res._height = 0;
  res._depth = 0;
  res._spectrum = 0;
  res._is_shared = false;
  puVar17 = this->_data;
  iVar6 = cimg::strncasecmp(permut,"xyzc",4);
  if (iVar6 == 0) {
    operator+(__return_storage_ptr__,this);
  }
  else {
    iVar6 = cimg::strncasecmp(permut,"xycz",4);
    if (iVar6 == 0) {
      assign(&res,this->_width,this->_height,this->_spectrum,this->_depth);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar12 = 0; lVar12 < (int)this->_spectrum; lVar12 = lVar12 + 1) {
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (iVar6 = 0; iVar6 < (int)this->_height; iVar6 = iVar6 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar12 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar13 +
                        (ulong)(res._width * iVar6 + iVar11)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"xzyc",4);
    if (iVar6 == 0) {
      assign(&res,this->_width,this->_depth,this->_height,this->_spectrum);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar12 = 0; lVar12 < (int)this->_spectrum; lVar12 = lVar12 + 1) {
        for (iVar6 = 0; iVar6 < (int)this->_depth; iVar6 = iVar6 + 1) {
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar12 +
                        (ulong)(res._width * iVar6 + iVar11)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"xzcy",4);
    if (iVar6 == 0) {
      assign(&res,this->_width,this->_depth,this->_spectrum,this->_height);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar12 = 0; lVar12 < (int)this->_spectrum; lVar12 = lVar12 + 1) {
        for (iVar6 = 0; iVar6 < (int)this->_depth; iVar6 = iVar6 + 1) {
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar12 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar13 +
                        (ulong)(res._width * iVar6 + iVar11)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"xcyz",4);
    if (iVar6 == 0) {
      assign(&res,this->_width,this->_spectrum,this->_height,this->_depth);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        for (lVar12 = 0; lVar12 < (int)this->_depth; lVar12 = lVar12 + 1) {
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar12 +
                        (ulong)(res._width * iVar6 + iVar11)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"xczy",4);
    if (iVar6 == 0) {
      assign(&res,this->_width,this->_spectrum,this->_depth,this->_height);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        for (lVar12 = 0; lVar12 < (int)this->_depth; lVar12 = lVar12 + 1) {
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar12 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar13 +
                        (ulong)(res._width * iVar6 + iVar11)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yxzc",4);
    if (iVar6 == 0) {
      assign(&res,this->_height,this->_width,this->_depth,this->_spectrum);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar12 = 0; lVar12 < (int)this->_spectrum; lVar12 = lVar12 + 1) {
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (iVar6 = 0; iVar6 < (int)this->_height; iVar6 = iVar6 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar12 +
                        (ulong)(res._width * iVar11 + iVar6)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yxcz",4);
    if (iVar6 == 0) {
      assign(&res,this->_height,this->_width,this->_spectrum,this->_depth);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar12 = 0; lVar12 < (int)this->_spectrum; lVar12 = lVar12 + 1) {
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (iVar6 = 0; iVar6 < (int)this->_height; iVar6 = iVar6 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar12 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar13 +
                        (ulong)(res._width * iVar11 + iVar6)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yzxc",4);
    if (iVar6 == 0) {
      assign(&res,this->_height,this->_depth,this->_width,this->_spectrum);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar12 = 0;
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (iVar6 = 0; iVar6 < (int)this->_depth; iVar6 = iVar6 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar6 + iVar11) * 4) = uVar8;
              lVar14 = lVar14 + lVar9 * 4;
            }
          }
        }
        lVar12 = lVar12 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yzcx",4);
    if (iVar6 == 0) {
      assign(&res,this->_height,this->_depth,this->_spectrum,this->_width);
      uVar8 = this->_width;
      switch(uVar8) {
      case 1:
        uVar8 = this->_depth;
        uVar3 = this->_height;
        uVar4 = this->_spectrum;
        for (lVar9 = 0; uVar8 * uVar3 * uVar4 != (int)lVar9; lVar9 = lVar9 + 1) {
          uVar2 = *puVar17;
          puVar17 = puVar17 + 1;
          res._data[lVar9] = uVar2;
        }
        break;
      case 2:
        iVar6 = this->_depth * this->_height * this->_spectrum;
        puVar7 = res._data;
        while (bVar5 = iVar6 != 0, iVar6 = iVar6 + -1, bVar5) {
          *puVar7 = *puVar17;
          puVar7[(res._8_8_ & 0xffffffff) * (ulong)res._height * (res._0_8_ & 0xffffffff)] =
               puVar17[1];
          puVar7 = puVar7 + 1;
          puVar17 = puVar17 + 2;
        }
        break;
      case 3:
        iVar6 = this->_depth * this->_height * this->_spectrum;
        lVar9 = (res._8_8_ & 0xffffffff) * (ulong)res._height * (res._0_8_ & 0xffffffff);
        puVar7 = res._data;
        while (bVar5 = iVar6 != 0, iVar6 = iVar6 + -1, bVar5) {
          *puVar7 = *puVar17;
          puVar7[lVar9] = puVar17[1];
          puVar7[lVar9 * 2] = puVar17[2];
          puVar7 = puVar7 + 1;
          puVar17 = puVar17 + 3;
        }
        break;
      case 4:
        lVar9 = (res._8_8_ & 0xffffffff) * (ulong)res._height * (res._0_8_ & 0xffffffff);
        iVar6 = this->_depth * this->_height * this->_spectrum;
        puVar7 = res._data;
        while (bVar5 = iVar6 != 0, iVar6 = iVar6 + -1, bVar5) {
          *puVar7 = *puVar17;
          puVar7[lVar9] = puVar17[1];
          puVar7[lVar9 * 2] = puVar17[2];
          puVar7[lVar9 * 3] = puVar17[3];
          puVar7 = puVar7 + 1;
          puVar17 = puVar17 + 4;
        }
        break;
      default:
        lVar9 = (ulong)res._height * (res._0_8_ & 0xffffffff);
        lVar12 = 0;
        for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
          for (iVar6 = 0; iVar6 < (int)this->_depth; iVar6 = iVar6 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
              lVar14 = (long)res._data + lVar12;
              for (lVar15 = 0; lVar15 < (int)uVar8; lVar15 = lVar15 + 1) {
                uVar8 = *puVar17;
                puVar17 = puVar17 + 1;
                *(uint *)(lVar14 + (ulong)(res._width * iVar6 + iVar11) * 4) = uVar8;
                uVar8 = this->_width;
                lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
              }
            }
          }
          lVar12 = lVar12 + lVar9 * 4;
        }
        CImg(__return_storage_ptr__,&res);
        goto LAB_00128895;
      }
    }
    iVar6 = cimg::strncasecmp(permut,"ycxz",4);
    if (iVar6 == 0) {
      assign(&res,this->_height,this->_spectrum,this->_width,this->_depth);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        lVar12 = 0;
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar6 + iVar11) * 4) = uVar8;
              lVar14 = lVar14 + lVar9 * 4;
            }
          }
          lVar12 = lVar12 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yczx",4);
    if (iVar6 == 0) {
      assign(&res,this->_height,this->_spectrum,this->_depth,this->_width);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        lVar12 = 0;
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar6 + iVar11) * 4) = uVar8;
              lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
            }
          }
          lVar12 = lVar12 + lVar9 * 4;
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zxyc",4);
    if (iVar6 == 0) {
      assign(&res,this->_depth,this->_width,this->_height,this->_spectrum);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar12 = 0; lVar12 < (int)this->_spectrum; lVar12 = lVar12 + 1) {
        for (iVar6 = 0; iVar6 < (int)this->_depth; iVar6 = iVar6 + 1) {
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar12 +
                        (ulong)(res._width * iVar11 + iVar6)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zxcy",4);
    if (iVar6 == 0) {
      assign(&res,this->_depth,this->_width,this->_spectrum,this->_height);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar12 = 0; lVar12 < (int)this->_spectrum; lVar12 = lVar12 + 1) {
        for (iVar6 = 0; iVar6 < (int)this->_depth; iVar6 = iVar6 + 1) {
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar12 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar13 +
                        (ulong)(res._width * iVar11 + iVar6)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zyxc",4);
    if (iVar6 == 0) {
      assign(&res,this->_depth,this->_height,this->_width,this->_spectrum);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar12 = 0;
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (iVar6 = 0; iVar6 < (int)this->_depth; iVar6 = iVar6 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar6) * 4) = uVar8;
              lVar14 = lVar14 + lVar9 * 4;
            }
          }
        }
        lVar12 = lVar12 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zycx",4);
    if (iVar6 == 0) {
      assign(&res,this->_depth,this->_height,this->_spectrum,this->_width);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar12 = 0;
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (iVar6 = 0; iVar6 < (int)this->_depth; iVar6 = iVar6 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar6) * 4) = uVar8;
              lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
            }
          }
        }
        lVar12 = lVar12 + lVar9 * 4;
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zcxy",4);
    if (iVar6 == 0) {
      assign(&res,this->_depth,this->_spectrum,this->_width,this->_height);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        for (iVar11 = 0; iVar11 < (int)this->_depth; iVar11 = iVar11 + 1) {
          lVar12 = 0;
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar6 + iVar11) * 4) = uVar8;
              lVar14 = lVar14 + lVar9 * 4;
            }
            lVar12 = lVar12 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zcyx",4);
    if (iVar6 == 0) {
      assign(&res,this->_depth,this->_spectrum,this->_height,this->_width);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        for (iVar11 = 0; iVar11 < (int)this->_depth; iVar11 = iVar11 + 1) {
          lVar12 = 0;
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar6 + iVar11) * 4) = uVar8;
              lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
            }
            lVar12 = lVar12 + lVar9 * 4;
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"cxyz",4);
    if (iVar6 == 0) {
      assign(&res,this->_spectrum,this->_width,this->_height,this->_depth);
      uVar8 = this->_spectrum;
      switch(uVar8) {
      case 1:
        puVar7 = this->_data;
        uVar8 = this->_width;
        uVar3 = this->_height;
        uVar4 = this->_depth;
        for (lVar9 = 0; (ulong)uVar4 * (ulong)uVar3 * (ulong)uVar8 - lVar9 != 0; lVar9 = lVar9 + 1)
        {
          res._data[lVar9] = puVar7[lVar9];
        }
        break;
      case 2:
        puVar7 = this->_data;
        lVar9 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        for (lVar12 = 0; lVar9 - lVar12 != 0; lVar12 = lVar12 + 1) {
          res._data[lVar12 * 2] = puVar7[lVar12];
          res._data[lVar12 * 2 + 1] = puVar7[lVar9 + lVar12];
        }
        break;
      case 3:
        puVar7 = this->_data;
        lVar12 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        puVar10 = res._data;
        lVar9 = lVar12;
        while (bVar5 = lVar9 != 0, lVar9 = lVar9 + -1, bVar5) {
          *puVar10 = *puVar7;
          puVar10[1] = puVar7[lVar12];
          puVar1 = puVar7 + lVar12 * 2;
          puVar7 = puVar7 + 1;
          puVar10[2] = *puVar1;
          puVar10 = puVar10 + 3;
        }
        break;
      case 4:
        puVar7 = this->_data;
        lVar12 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        puVar10 = res._data;
        lVar9 = lVar12;
        while (bVar5 = lVar9 != 0, lVar9 = lVar9 + -1, bVar5) {
          *puVar10 = *puVar7;
          puVar10[1] = puVar7[lVar12];
          puVar10[2] = puVar7[lVar12 * 2];
          puVar1 = puVar7 + lVar12 * 3;
          puVar7 = puVar7 + 1;
          puVar10[3] = *puVar1;
          puVar10 = puVar10 + 4;
        }
        break;
      default:
        lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
        for (iVar6 = 0; iVar6 < (int)uVar8; iVar6 = iVar6 + 1) {
          for (lVar12 = 0; lVar12 < (int)this->_depth; lVar12 = lVar12 + 1) {
            for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
              for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
                uVar8 = *puVar17;
                puVar17 = puVar17 + 1;
                res._data[lVar9 * lVar13 +
                          (res._8_8_ & 0xffffffff) * lVar9 * lVar12 +
                          (ulong)(res._width * iVar11 + iVar6)] = uVar8;
              }
            }
          }
          uVar8 = this->_spectrum;
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"cxzy",4);
    if (iVar6 == 0) {
      assign(&res,this->_spectrum,this->_width,this->_depth,this->_height);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        for (lVar12 = 0; lVar12 < (int)this->_depth; lVar12 = lVar12 + 1) {
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              res._data[lVar9 * lVar12 +
                        (res._8_8_ & 0xffffffff) * lVar9 * lVar13 +
                        (ulong)(res._width * iVar11 + iVar6)] = uVar8;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"cyxz",4);
    if (iVar6 == 0) {
      assign(&res,this->_spectrum,this->_height,this->_width,this->_depth);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        lVar12 = 0;
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar6) * 4) = uVar8;
              lVar14 = lVar14 + lVar9 * 4;
            }
          }
          lVar12 = lVar12 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"cyzx",4);
    if (iVar6 == 0) {
      assign(&res,this->_spectrum,this->_height,this->_depth,this->_width);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        lVar12 = 0;
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar6) * 4) = uVar8;
              lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
            }
          }
          lVar12 = lVar12 + lVar9 * 4;
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"czxy",4);
    if (iVar6 == 0) {
      assign(&res,this->_spectrum,this->_depth,this->_width,this->_height);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        for (iVar11 = 0; iVar11 < (int)this->_depth; iVar11 = iVar11 + 1) {
          lVar12 = 0;
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar6) * 4) = uVar8;
              lVar14 = lVar14 + lVar9 * 4;
            }
            lVar12 = lVar12 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"czyx",4);
    if (iVar6 == 0) {
      assign(&res,this->_spectrum,this->_depth,this->_height,this->_width);
      lVar9 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar6 = 0; iVar6 < (int)this->_spectrum; iVar6 = iVar6 + 1) {
        for (iVar11 = 0; iVar11 < (int)this->_depth; iVar11 = iVar11 + 1) {
          lVar12 = 0;
          for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
            lVar14 = (long)res._data + lVar12;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar8 = *puVar17;
              puVar17 = puVar17 + 1;
              *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar6) * 4) = uVar8;
              lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar9 * 4;
            }
            lVar12 = lVar12 + lVar9 * 4;
          }
        }
      }
    }
    if (res._data == (uint *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      pcVar16 = "non-";
      if (this->_is_shared != false) {
        pcVar16 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified permutation \'%s\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar16,"unsigned int",permut);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
    }
    CImg(__return_storage_ptr__,&res);
  }
LAB_00128895:
  ~CImg(&res);
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _get_permute_axes(const char *const permut, const t&) const {
      if (is_empty() || !permut) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      if (!cimg::strncasecmp(permut,"xyzc",4)) return +*this;
      if (!cimg::strncasecmp(permut,"xycz",4)) {
	res.assign(_width,_height,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzyc",4)) {
	res.assign(_width,_depth,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzcy",4)) {
	res.assign(_width,_depth,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xcyz",4)) {
	res.assign(_width,_spectrum,_height,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xczy",4)) {
	res.assign(_width,_spectrum,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxzc",4)) {
	res.assign(_height,_width,_depth,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxcz",4)) {
	res.assign(_height,_width,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzxc",4)) {
	res.assign(_height,_depth,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzcx",4)) {
	res.assign(_height,_depth,_spectrum,_width);
	switch (_width) {
	case 1 : {
	  t *ptr_r = res.data(0,0,0,0);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++);
	  }
	} break;
	case 2 : {
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++);
	  }
	} break;
	case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++);
	  }
	} break;
	case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++); *(ptr_a++) = (t)*(ptrs++);
	  }
	} break;
	default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	  cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
          return res;
	}
	}
      }
      if (!cimg::strncasecmp(permut,"ycxz",4)) {
	res.assign(_height,_spectrum,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yczx",4)) {
	res.assign(_height,_spectrum,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxyc",4)) {
	res.assign(_depth,_width,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxcy",4)) {
	res.assign(_depth,_width,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zyxc",4)) {
	res.assign(_depth,_height,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zycx",4)) {
	res.assign(_depth,_height,_spectrum,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcxy",4)) {
	res.assign(_depth,_spectrum,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcyx",4)) {
	res.assign(_depth,_spectrum,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cxyz",4)) {
	res.assign(_spectrum,_width,_height,_depth);
	switch (_spectrum) {
	case 1 : {
	  const T *ptr_r = data(0,0,0,0);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
	} break;
	case 2 : {
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++);
	  }
	} break;
	case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++);
	  }
	} break;
	case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++); *(ptrd++) = (t)*(ptr_a++);
	  }
	} break;
	default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	  cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
	}
	}
      }
      if (!cimg::strncasecmp(permut,"cxzy",4)) {
	res.assign(_spectrum,_width,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyxz",4)) {
	res.assign(_spectrum,_height,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyzx",4)) {
	res.assign(_spectrum,_height,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czxy",4)) {
	res.assign(_spectrum,_depth,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czyx",4)) {
	res.assign(_spectrum,_depth,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified permutation '%s'.",
                                    cimg_instance,
                                    permut);
      return res;
    }